

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

double __thiscall Fl_Input_::expandpos(Fl_Input_ *this,char *p,char *e,char *buf,int *returnn)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  int c;
  int l;
  int chr;
  int n;
  int *returnn_local;
  char *buf_local;
  char *e_local;
  char *p_local;
  Fl_Input_ *this_local;
  
  l = 0;
  c = 0;
  iVar2 = input_type(this);
  e_local = p;
  if (iVar2 == 5) {
    for (; e_local < e; e_local = e_local + iVar2) {
      iVar2 = fl_utf8len(*e_local);
      if (0 < iVar2) {
        l = l_secret + l;
      }
    }
  }
  else {
    for (; e_local < e; e_local = e_local + 1) {
      bVar1 = *e_local;
      if ((bVar1 < 0x20) || (bVar1 == 0x7f)) {
        if ((bVar1 == 9) && (iVar2 = input_type(this), iVar2 == 4)) {
          l = (8 - c % 8) + l;
          c = (7 - c % 8) + c;
        }
        else {
          l = l + 2;
        }
      }
      else {
        l = l + 1;
      }
      iVar2 = fl_utf8len(*e_local);
      c = (uint)(0 < iVar2) + c;
    }
  }
  if (returnn != (int *)0x0) {
    *returnn = l;
  }
  dVar3 = fl_width(buf,l);
  return dVar3;
}

Assistant:

double Fl_Input_::expandpos(
  const char* p,	// real string
  const char* e,	// pointer into real string
  const char* buf,	// conversion of real string by expand()
  int* returnn		// return offset into buf here
) const {
  int n = 0;
  int chr = 0;
  int l;
  if (input_type()==FL_SECRET_INPUT) {
    while (p<e) {
      l = fl_utf8len((char)p[0]);
      if (l >= 1) n += l_secret;
      p += l;
    }
  } else while (p<e) {
    int c = *p & 255;
    if (c < ' ' || c == 127) {
      if (c == '\t' && input_type()==FL_MULTILINE_INPUT) {
         n += 8-(chr%8);
         chr += 7-(chr%8);
      } else n += 2;
    } else {
      n++;
    }
    chr += fl_utf8len((char)p[0]) >= 1;
    p++;
  }
  if (returnn) *returnn = n;
  return fl_width(buf, n);
}